

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

void StringFormatter<int>::applytype(ostream *os,char type)

{
  long lVar1;
  _Ios_Fmtflags __fmtfl;
  runtime_error *this;
  char type_local;
  ostream *os_local;
  
  switch(type) {
  case 'A':
  case 'a':
    lVar1 = *(long *)(*(long *)os + -0x18);
    __fmtfl = std::operator|(_S_fixed,_S_scientific);
    std::ios_base::setf((ios_base *)(os + lVar1),__fmtfl,_S_floatfield);
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unknown format char");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 'E':
  case 'e':
    std::ostream::operator<<(os,std::scientific);
    break;
  case 'F':
  case 'f':
    std::ostream::operator<<(os,std::fixed);
    break;
  case 'G':
  case 'g':
    std::ios_base::unsetf((ios_base *)(os + *(long *)(*(long *)os + -0x18)),_S_floatfield);
    break;
  case 'X':
  case 'x':
    std::ostream::operator<<(os,std::hex);
    break;
  case 'b':
    break;
  case 'c':
  case 's':
    std::ostream::operator<<(os,std::dec);
    break;
  case 'd':
  case 'i':
  case 'u':
    std::ostream::operator<<(os,std::dec);
    break;
  case 'o':
    std::ostream::operator<<(os,std::oct);
    break;
  case 'p':
  }
  if ((type < 'A') || ('Z' < type)) {
    std::ostream::operator<<(os,std::nouppercase);
  }
  else {
    std::ostream::operator<<(os,std::uppercase);
  }
  return;
}

Assistant:

static void applytype(std::ostream& os, char type)
    {
        // unused type/size chars: b k m n r v w y
        switch(type)
        {
            case 'b': // 'b' for Hex::dumper
                // '-':  only hex, otherwise: hex + ascii
                // '0':  no spaces
                break;
            case 'i':
            case 'd':
            case 'u': // unsigned is part of type
                os << std::dec;
                break;
            case 'o':
                os << std::oct;
                break;
            case 'x':
            case 'X':
                os << std::hex;
                break;
            case 'f': // 123.45
            case 'F':
                os << std::fixed;
                break;
            case 'g':  // shortest of 123.45 and 1.23e+2
            case 'G':
                os.unsetf(os.floatfield);
//                os << std::defaultfloat;
                break;
            case 'a':  // hexadecimal floats
            case 'A':
                os.setf(os.fixed | os.scientific, os.floatfield);
//                os << std::hexfloat;
                break;
            case 'e': // 1.23e+2
            case 'E':
                os << std::scientific;
                break;
            case 'c': // char -> need explicit cast
            case 's': // string - from type
                // reset to decimal
                os << std::dec;
                break;
            case 'p': // pointer value - cast to (void*)
                break;
            default:
                throw std::runtime_error("unknown format char");
        }
        if ('A'<=type && type<='Z')
                os << std::uppercase;
        else
                os << std::nouppercase;
    }